

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall CommandDrawBar::ParseComparator(CommandDrawBar *this,FScanner *sc)

{
  bool bVar1;
  bool bVar2;
  PClassActor *ti;
  
  bVar1 = FScanner::CheckToken(sc,0x28);
  bVar2 = FScanner::CheckToken(sc,0x101);
  if (!bVar2) {
    if (!bVar1) {
      return;
    }
    bVar2 = FScanner::CheckToken(sc,0x102);
    if (!bVar2) {
      bVar1 = FScanner::CheckToken(sc,0x104);
      if (bVar1) {
        (this->data).useMaximumConstant = true;
        (this->data).field_1.value = sc->Number;
      }
      goto LAB_00575dd6;
    }
  }
  ti = PClass::FindActor(sc->String);
  (this->data).field_1.inventoryItem = ti;
  if ((ti == (PClassActor *)0x0) ||
     (bVar2 = PClass::IsAncestorOf(AInventory::RegistrationInfo.MyClass,&ti->super_PClass), !bVar2))
  {
    FScanner::ScriptMessage(sc,"\'%s\' is not a type of inventory item.",sc->String);
    (this->data).field_1.inventoryItem = (PClassActor *)AInventory::RegistrationInfo.MyClass;
  }
  if (!bVar1) {
    return;
  }
LAB_00575dd6:
  FScanner::MustGetToken(sc,0x29);
  return;
}

Assistant:

void	ParseComparator(FScanner &sc)
		{
			bool extendedSyntax = sc.CheckToken('(');

			if(sc.CheckToken(TK_Identifier) || (extendedSyntax && sc.CheckToken(TK_StringConst))) //comparing reference
			{
				data.inventoryItem = PClass::FindActor(sc.String);
				if(data.inventoryItem == NULL || !RUNTIME_CLASS(AInventory)->IsAncestorOf(data.inventoryItem)) //must be a kind of inventory
				{
					sc.ScriptMessage("'%s' is not a type of inventory item.", sc.String);
					data.inventoryItem = RUNTIME_CLASS(AInventory);
				}
			}
			else if(extendedSyntax && sc.CheckToken(TK_IntConst))
			{
				data.useMaximumConstant = true;
				data.value = sc.Number;
			}

			if(extendedSyntax)
				sc.MustGetToken(')');
		}